

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

string * __thiscall
clipp::usage_lines::param_label_abi_cxx11_(usage_lines *this,parameter *p,context *cur)

{
  bool bVar1;
  size_type sVar2;
  string *psVar3;
  size_type sVar4;
  int *piVar5;
  const_reference pvVar6;
  doc_string *__lhs;
  ulong uVar7;
  doc_string *__rhs;
  long in_RCX;
  parameter *in_RDX;
  long in_RSI;
  string *in_RDI;
  doc_formatting *this_00;
  int i;
  bool sep;
  bool surrAlt;
  int n;
  arg_list *flags;
  string lbl;
  bool showrep;
  bool showopt;
  bool outermost;
  bool startsOptionalSequence;
  group *parent;
  context *in_stack_fffffffffffffe90;
  allocator *paVar8;
  memento *in_stack_fffffffffffffe98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  byte local_139;
  byte local_12b;
  byte local_12a;
  bool local_129;
  bool local_109;
  allocator local_101;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [36];
  int local_7c;
  char local_76;
  byte local_75;
  int local_74;
  int local_70;
  int local_6c;
  arg_list *local_68;
  string local_50 [36];
  byte local_2c;
  byte local_2b;
  bool local_2a;
  bool local_29;
  group *local_28;
  long local_20;
  parameter *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_28 = group::depth_first_traverser::parent((depth_first_traverser *)0x1a764e);
  sVar2 = group::size((group *)0x1a7663);
  local_109 = false;
  if (1 < sVar2) {
    bVar1 = detail::token<clipp::parameter>::blocking(&local_18->super_token<clipp::parameter>);
    local_109 = false;
    if (bVar1) {
      local_109 = group::depth_first_traverser::is_first_in_parent
                            ((depth_first_traverser *)in_stack_fffffffffffffe98);
    }
  }
  local_29 = local_109;
  local_129 = false;
  if ((*(byte *)(in_RSI + 0x2d0) & 1) != 0) {
    local_129 = *(group **)(local_20 + 0xc0) == local_28;
  }
  local_2a = local_129;
  bVar1 = context::is_alternative((context *)0x1a76f8);
  local_12a = 0;
  if (!bVar1) {
    bVar1 = parameter::required(local_18);
    local_12a = 0;
    if ((!bVar1) && (local_12a = 0, (local_29 & 1U) == 0)) {
      local_12a = local_2a ^ 0xff;
    }
  }
  local_2b = local_12a & 1;
  bVar1 = detail::token<clipp::parameter>::repeatable(&local_18->super_token<clipp::parameter>);
  local_12b = 0;
  if (bVar1) {
    local_12b = local_2a ^ 0xff;
  }
  local_2c = local_12b & 1;
  std::__cxx11::string::string(local_50);
  if ((local_2c & 1) != 0) {
    psVar3 = doc_formatting::repeat_prefix_abi_cxx11_((doc_formatting *)(in_RSI + 8));
    std::__cxx11::string::operator+=(local_50,(string *)psVar3);
  }
  if ((local_2b & 1) != 0) {
    psVar3 = doc_formatting::optional_prefix_abi_cxx11_((doc_formatting *)(in_RSI + 8));
    std::__cxx11::string::operator+=(local_50,(string *)psVar3);
  }
  local_68 = parameter::flags_abi_cxx11_(local_18);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_fffffffffffffea0);
  if (bVar1) {
    __lhs = parameter::label_abi_cxx11_(local_18);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      doc_formatting::label_prefix_abi_cxx11_((doc_formatting *)(in_RSI + 8));
      __rhs = parameter::label_abi_cxx11_(local_18);
      std::operator+(__lhs,__rhs);
      doc_formatting::label_postfix_abi_cxx11_((doc_formatting *)(in_RSI + 8));
      std::operator+(in_stack_fffffffffffffe98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe90);
      std::__cxx11::string::operator+=(local_50,local_a0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_c0);
    }
    else {
      doc_formatting::empty_label_abi_cxx11_((doc_formatting *)(in_RSI + 8));
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        paVar8 = &local_101;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(in_RDI,"",paVar8);
        std::allocator<char>::~allocator((allocator<char> *)&local_101);
        goto LAB_001a7cbc;
      }
      this_00 = (doc_formatting *)(in_RSI + 8);
      doc_formatting::label_prefix_abi_cxx11_(this_00);
      doc_formatting::empty_label_abi_cxx11_(this_00);
      std::operator+(__lhs,in_stack_fffffffffffffeb0);
      doc_formatting::label_postfix_abi_cxx11_((doc_formatting *)(in_RSI + 8));
      std::operator+((memento *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe90);
      std::__cxx11::string::operator+=(local_50,local_e0);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_100);
    }
  }
  else {
    local_70 = doc_formatting::max_flags_per_param_in_usage((doc_formatting *)(in_RSI + 8));
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_68);
    local_74 = (int)sVar4;
    piVar5 = std::min<int>(&local_70,&local_74);
    local_6c = *piVar5;
    local_139 = 0;
    if ((1 < local_6c) && (local_139 = 0, (local_2b & 1) == 0)) {
      bVar1 = context::is_singleton(in_stack_fffffffffffffe90);
      local_139 = bVar1 ^ 0xff;
    }
    local_75 = local_139 & 1;
    if (local_75 != 0) {
      psVar3 = doc_formatting::alternative_flags_prefix_abi_cxx11_((doc_formatting *)(in_RSI + 8));
      std::__cxx11::string::operator+=(local_50,(string *)psVar3);
    }
    local_76 = '\0';
    for (local_7c = 0; local_7c < local_6c; local_7c = local_7c + 1) {
      if (local_76 != '\0') {
        bVar1 = context::is_singleton(in_stack_fffffffffffffe90);
        if (bVar1) {
          psVar3 = doc_formatting::alternative_group_separator_abi_cxx11_
                             ((doc_formatting *)(in_RSI + 8));
          std::__cxx11::string::operator+=(local_50,(string *)psVar3);
        }
        else {
          psVar3 = doc_formatting::flag_separator_abi_cxx11_((doc_formatting *)(in_RSI + 8));
          std::__cxx11::string::operator+=(local_50,(string *)psVar3);
        }
      }
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_68,(long)local_7c);
      std::__cxx11::string::operator+=(local_50,(string *)pvVar6);
      local_76 = '\x01';
    }
    if ((local_75 & 1) != 0) {
      psVar3 = doc_formatting::alternative_flags_postfix_abi_cxx11_((doc_formatting *)(in_RSI + 8));
      std::__cxx11::string::operator+=(local_50,(string *)psVar3);
    }
  }
  if ((local_2b & 1) != 0) {
    psVar3 = doc_formatting::optional_postfix_abi_cxx11_((doc_formatting *)(in_RSI + 8));
    std::__cxx11::string::operator+=(local_50,(string *)psVar3);
  }
  if ((local_2c & 1) != 0) {
    psVar3 = doc_formatting::repeat_postfix_abi_cxx11_((doc_formatting *)(in_RSI + 8));
    std::__cxx11::string::operator+=(local_50,(string *)psVar3);
  }
  std::__cxx11::string::string(in_RDI,local_50);
LAB_001a7cbc:
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

string param_label(const parameter& p, const context& cur) const
    {
        const auto& parent = cur.pos.parent();

        const bool startsOptionalSequence =
            parent.size() > 1 && p.blocking() && cur.pos.is_first_in_parent();

        const bool outermost =
            ommitOutermostSurrounders_ && cur.outermost == &parent;

        const bool showopt = !cur.is_alternative() && !p.required()
            && !startsOptionalSequence && !outermost;

        const bool showrep = p.repeatable() && !outermost;

        string lbl;

        if(showrep) lbl += fmt_.repeat_prefix();
        if(showopt) lbl += fmt_.optional_prefix();

        const auto& flags = p.flags();
        if(!flags.empty()) {
            const int n = std::min(fmt_.max_flags_per_param_in_usage(),
                                   int(flags.size()));

            const bool surrAlt = n > 1 && !showopt && !cur.is_singleton();

            if(surrAlt) lbl += fmt_.alternative_flags_prefix();
            bool sep = false;
            for(int i = 0; i < n; ++i) {
                if(sep) {
                    if(cur.is_singleton())
                        lbl += fmt_.alternative_group_separator();
                    else
                        lbl += fmt_.flag_separator();
                }
                lbl += flags[i];
                sep = true;
            }
            if(surrAlt) lbl += fmt_.alternative_flags_postfix();
        }
        else {
             if(!p.label().empty()) {
                 lbl += fmt_.label_prefix()
                     + p.label()
                     + fmt_.label_postfix();
             } else if(!fmt_.empty_label().empty()) {
                 lbl += fmt_.label_prefix()
                     + fmt_.empty_label()
                     + fmt_.label_postfix();
             } else {
                 return "";
             }
        }

        if(showopt) lbl += fmt_.optional_postfix();
        if(showrep) lbl += fmt_.repeat_postfix();

        return lbl;
    }